

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void testConsumeComment(void)

{
  FILE *__stream;
  bool bVar1;
  streambuf *psVar2;
  string local_4f8;
  undefined1 local_4d8 [8];
  Node node;
  undefined1 local_448 [8];
  string commentDescriptor;
  undefined1 local_408 [8];
  string result;
  regex pattern;
  string emptyString;
  stringstream local_398 [8];
  stringstream buffer;
  ostream local_388 [376];
  undefined1 local_210 [8];
  ifstream file;
  
  std::ifstream::ifstream(local_210,"source/commentTest.html",8);
  std::__cxx11::stringstream::stringstream(local_398);
  psVar2 = (streambuf *)std::ifstream::rdbuf();
  std::ostream::operator<<(local_388,psVar2);
  std::__cxx11::string::string
            ((string *)
             &pattern._M_automaton.
              super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)((long)&result.field_2 + 8),
             "<!--.*?-->",0x10);
  std::__cxx11::stringstream::str();
  std::
  regex_replace<std::__cxx11::regex_traits<char>,char,std::char_traits<char>,std::allocator<char>,std::char_traits<char>,std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_408,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&commentDescriptor.field_2 + 8),
             (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)((long)&result.field_2 + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &pattern._M_automaton.
              super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,0);
  std::__cxx11::string::~string((string *)(commentDescriptor.field_2._M_local_buf + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_448,"<!--",
             (allocator<char> *)
             ((long)&node.parent.super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&node.parent.super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  test_count = test_count + 1;
  bVar1 = crawler::contains((string *)local_448,(string *)local_408);
  __stream = _stderr;
  if (((bVar1 ^ 0xffU) & 1) == 1) {
    test_pass = test_pass + 1;
  }
  else {
    bVar1 = crawler::contains((string *)local_448,(string *)local_408);
    fprintf(__stream,"function %s(): %s:%d  Assertion `%s` failed. expect: %d actual: %d\n",
            "testConsumeComment",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ramsayleung[P]crawler/test.cpp"
            ,0x76,"true == (!crawler::contains(commentDescriptor, result))",1,
            (uint)((bVar1 ^ 0xffU) & 1));
    main_ret = 1;
  }
  std::__cxx11::stringstream::str();
  crawler::parse((Node *)local_4d8,&local_4f8);
  std::__cxx11::string::~string((string *)&local_4f8);
  printNode((Node *)local_4d8);
  crawler::Node::~Node((Node *)local_4d8);
  std::__cxx11::string::~string((string *)local_448);
  std::__cxx11::string::~string((string *)local_408);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)((long)&result.field_2 + 8));
  std::__cxx11::string::~string
            ((string *)
             &pattern._M_automaton.
              super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__cxx11::stringstream::~stringstream(local_398);
  std::ifstream::~ifstream(local_210);
  return;
}

Assistant:

void testConsumeComment() {
  std::ifstream file("source/commentTest.html");
  std::stringstream buffer;
  buffer << file.rdbuf();
  std::string emptyString;
  std::regex pattern(R"(<!--.*?-->)");
  std::string result = std::regex_replace(buffer.str(), pattern, emptyString);
  std::string commentDescriptor("<!--");
  ASSERT_TRUE(!crawler::contains(commentDescriptor, result));
  crawler::Node node = crawler::parse(buffer.str());
  printNode(node);
}